

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glmath.c
# Opt level: O0

void multiply(mat4 *m,mat4 *m1,mat4 *m2)

{
  int q;
  int p;
  int i;
  float total;
  int index;
  int r;
  int c;
  mat4 result;
  mat4 *m2_local;
  mat4 *m1_local;
  mat4 *m_local;
  
  result.value._56_8_ = m2;
  for (index = 0; index < 4; index = index + 1) {
    for (total = 0.0; (int)total < 4; total = (float)((int)total + 1)) {
      p = 0;
      for (q = 0; q < 4; q = q + 1) {
        p = (int)(m1->value[q * 4 + (int)total] *
                  *(float *)(result.value._56_8_ + (long)(index * 4 + q) * 4) + (float)p);
      }
      (&r)[index * 4 + (int)total] = p;
    }
  }
  memcpy(m,&r,0x40);
  return;
}

Assistant:

void multiply(mat4 *m, mat4 *m1, mat4 *m2)
{
    mat4 result;
    for (int c = 0; c < 4; c++) {
        for (int r = 0; r < 4; r++) {
            int index = c * 4 + r;
            float total = 0;
            for (int i = 0; i < 4; i++) {
                int p = i * 4 + r;
                int q = c * 4 + i;
                total += m1->value[p] * m2->value[q];
            }
            result.value[index] = total;
        }
    }
    *m = result;
}